

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_second_step1.cpp
# Opt level: O3

bool __thiscall
ruckig::PositionSecondOrderStep1::get_profile
          (PositionSecondOrderStep1 *this,Profile *input,Block *block)

{
  array<ruckig::Profile,_3UL> *valid_profiles;
  double dVar1;
  bool bVar2;
  long lVar3;
  Profile *p;
  BrakeProfile *pBVar4;
  BrakeProfile *pBVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double in_XMM3_Qa;
  double dVar10;
  double dVar11;
  ProfileIter profile;
  ProfileIter local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  dVar11 = this->_vMax;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    dVar10 = this->_vMin;
    if ((dVar10 == 0.0) && (!NAN(dVar10))) {
      (block->p_min).a._M_elems[0] = (input->a)._M_elems[0];
      (block->p_min).v._M_elems[0] = (input->v)._M_elems[0];
      (block->p_min).p._M_elems[0] = (input->p)._M_elems[0];
      (block->p_min).af = input->af;
      dVar11 = input->vf;
      (block->p_min).pf = input->pf;
      (block->p_min).vf = dVar11;
      pBVar4 = &input->brake;
      pBVar5 = &(block->p_min).brake;
      for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
        pBVar5->duration = pBVar4->duration;
        pBVar4 = (BrakeProfile *)&pBVar4->t;
        pBVar5 = (BrakeProfile *)&pBVar5->t;
      }
      pBVar4 = &input->accel;
      pBVar5 = &(block->p_min).accel;
      for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
        pBVar5->duration = pBVar4->duration;
        pBVar4 = (BrakeProfile *)&pBVar4->t;
        pBVar5 = (BrakeProfile *)&pBVar5->t;
      }
      bVar2 = time_all_single_step(this,&block->p_min,this->_vMax,this->_vMin,dVar10,in_XMM3_Qa);
      if (bVar2) {
        dVar11 = (block->p_min).t_sum._M_elems[6] + (block->p_min).brake.duration +
                 (block->p_min).accel.duration;
        block->t_min = dVar11;
        bVar2 = true;
        if (2.220446049250313e-16 < ABS(this->v0)) {
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = dVar11;
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = INFINITY
          ;
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.
          duration = 0.0;
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.accel.
          duration = 0.0;
          if ((block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
              super__Optional_payload_base<ruckig::Block::Interval>._M_engaged == false) {
            (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
            super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
          }
        }
      }
      else {
        bVar2 = false;
      }
      return bVar2;
    }
  }
  valid_profiles = &this->valid_profiles;
  (this->valid_profiles)._M_elems[0].a._M_elems[0] = (input->a)._M_elems[0];
  (this->valid_profiles)._M_elems[0].v._M_elems[0] = (input->v)._M_elems[0];
  (this->valid_profiles)._M_elems[0].p._M_elems[0] = (input->p)._M_elems[0];
  (this->valid_profiles)._M_elems[0].af = input->af;
  dVar10 = input->vf;
  (this->valid_profiles)._M_elems[0].pf = input->pf;
  (this->valid_profiles)._M_elems[0].vf = dVar10;
  pBVar4 = &input->brake;
  pBVar5 = &(this->valid_profiles)._M_elems[0].brake;
  for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
    pBVar5->duration = pBVar4->duration;
    pBVar4 = (BrakeProfile *)&pBVar4->t;
    pBVar5 = (BrakeProfile *)&pBVar5->t;
  }
  pBVar4 = &input->accel;
  pBVar5 = &(this->valid_profiles)._M_elems[0].accel;
  for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
    pBVar5->duration = pBVar4->duration;
    pBVar4 = (BrakeProfile *)&pBVar4->t;
    pBVar5 = (BrakeProfile *)&pBVar5->t;
  }
  local_60 = valid_profiles->_M_elems;
  if (2.220446049250313e-16 <= ABS(this->vf)) {
    time_none(this,&local_60,dVar11,this->_vMin,this->_aMax,this->_aMin,false);
    time_none(this,&local_60,this->_vMin,this->_vMax,this->_aMin,this->_aMax,false);
    time_acc0(this,&local_60,this->_vMax,this->_vMin,this->_aMax,this->_aMin,false);
    uVar8 = SUB84(this->_vMax,0);
    uVar9 = (undefined4)((ulong)this->_vMax >> 0x20);
    uVar6 = SUB84(this->_vMin,0);
    uVar7 = (undefined4)((ulong)this->_vMin >> 0x20);
    dVar11 = this->_aMin;
    dVar10 = this->_aMax;
  }
  else {
    dVar10 = this->pd;
    dVar1 = this->_vMin;
    uVar6 = SUB84(dVar1,0);
    uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
    if (dVar10 < 0.0) {
      uVar6 = SUB84(dVar11,0);
      uVar7 = (undefined4)((ulong)dVar11 >> 0x20);
      dVar11 = dVar1;
    }
    local_38 = (double)(~-(ulong)(dVar10 < 0.0) & (ulong)this->_aMax |
                       -(ulong)(dVar10 < 0.0) & (ulong)this->_aMin);
    local_48 = this->_aMax;
    if (dVar10 >= 0.0) {
      local_48 = this->_aMin;
    }
    uStack_30 = 0;
    uStack_40 = 0;
    local_58 = (double)CONCAT44(uVar7,uVar6);
    local_50 = dVar11;
    time_none(this,&local_60,dVar11,(double)CONCAT44(uVar7,uVar6),local_38,local_48,true);
    if (((valid_profiles < local_60) ||
        (time_acc0(this,&local_60,local_50,local_58,local_38,local_48,false),
        valid_profiles < local_60)) ||
       (time_none(this,&local_60,local_58,local_50,local_48,local_38,true),
       valid_profiles < local_60)) goto LAB_0013c1e8;
    uVar6 = SUB84(local_58,0);
    uVar7 = (undefined4)((ulong)local_58 >> 0x20);
    uVar8 = SUB84(local_50,0);
    uVar9 = (undefined4)((ulong)local_50 >> 0x20);
    dVar10 = local_38;
    dVar11 = local_48;
  }
  time_acc0(this,&local_60,(double)CONCAT44(uVar7,uVar6),(double)CONCAT44(uVar9,uVar8),dVar11,dVar10
            ,false);
LAB_0013c1e8:
  bVar2 = Block::calculate_block<3ul,true>
                    (block,valid_profiles,
                     ((long)local_60 - (long)valid_profiles >> 6) * -0x71c71c71c71c71c7);
  return bVar2;
}

Assistant:

bool PositionSecondOrderStep1::get_profile(const Profile& input, Block& block) {
    // Zero-limits special case
    if (_vMax == 0.0 && _vMin == 0.0) {
        auto& p = block.p_min;
        p.set_boundary(input);

        if (time_all_single_step(&p, _vMax, _vMin, _aMax, _aMin)) {
            block.t_min = p.t_sum.back() + p.brake.duration + p.accel.duration;
            if (std::abs(v0) > DBL_EPSILON) {
                block.a = Block::Interval(block.t_min, std::numeric_limits<double>::infinity());
            }
            return true;
        }
        return false;
    }

    const ProfileIter start = valid_profiles.begin();
    ProfileIter profile = start;
    profile->set_boundary(input);

    if (std::abs(vf) < DBL_EPSILON) {
        // There is no blocked interval when vf==0, so return after first found profile
        const double vMax = (pd >= 0) ? _vMax : _vMin;
        const double vMin = (pd >= 0) ? _vMin : _vMax;
        const double aMax = (pd >= 0) ? _aMax : _aMin;
        const double aMin = (pd >= 0) ? _aMin : _aMax;

        time_none(profile, vMax, vMin, aMax, aMin, true);
        if (profile > start) { goto return_block; }
        time_acc0(profile, vMax, vMin, aMax, aMin, true);
        if (profile > start) { goto return_block; }

        time_none(profile, vMin, vMax, aMin, aMax, true);
        if (profile > start) { goto return_block; }
        time_acc0(profile, vMin, vMax, aMin, aMax, true);

    } else {
        time_none(profile, _vMax, _vMin, _aMax, _aMin, false);
        time_none(profile, _vMin, _vMax, _aMin, _aMax, false);
        time_acc0(profile, _vMax, _vMin, _aMax, _aMin, false);
        time_acc0(profile, _vMin, _vMax, _aMin, _aMax, false);
    }

return_block:
    return Block::calculate_block(block, valid_profiles, std::distance(start, profile));
}